

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

int send_finished(ptls_t *tls,ptls_buffer_t *sendbuf)

{
  size_t rec_start;
  size_t sVar1;
  st_ptls_hash_context_t *psVar2;
  int iVar3;
  size_t sVar4;
  ulong uVar5;
  long lVar6;
  size_t sVar7;
  undefined1 local_2c;
  undefined2 local_2b;
  undefined1 local_29;
  
  rec_start = sendbuf->off;
  local_2b = 0x316;
  local_29 = 1;
  iVar3 = ptls_buffer__do_pushv(sendbuf,&local_2b,3);
  if (iVar3 == 0) {
    iVar3 = ptls_buffer__do_pushv(sendbuf,"",2);
    if (iVar3 == 0) {
      sVar1 = sendbuf->off;
      local_2c = 0x14;
      iVar3 = ptls_buffer__do_pushv(sendbuf,&local_2c,1);
      if (iVar3 == 0) {
        iVar3 = ptls_buffer__do_pushv(sendbuf,"",3);
        if (iVar3 == 0) {
          sVar7 = sendbuf->off;
          iVar3 = ptls_buffer_reserve(sendbuf,tls->key_schedule->algo->digest_size);
          if (iVar3 == 0) {
            iVar3 = calc_verify_data(sendbuf->base + sendbuf->off,tls->key_schedule,
                                     &(tls->traffic_protection).enc);
            if (iVar3 == 0) {
              sVar4 = sendbuf->off + tls->key_schedule->algo->digest_size;
              sendbuf->off = sVar4;
              uVar5 = sVar4 - sVar7;
              for (lVar6 = 0x10; lVar6 != -8; lVar6 = lVar6 + -8) {
                sendbuf->base[sVar7 - 3] = (uint8_t)(uVar5 >> ((byte)lVar6 & 0x3f));
                sVar7 = sVar7 + 1;
              }
              sVar7 = sendbuf->off;
              if (tls->key_schedule != (st_ptls_key_schedule_t *)0x0) {
                psVar2 = tls->key_schedule->msghash;
                (*psVar2->update)(psVar2,sendbuf->base + sVar1,sVar7 - sVar1);
                sVar7 = sendbuf->off;
              }
              sendbuf->base[sVar1 - 2] = (uint8_t)(sVar7 - sVar1 >> 8);
              sendbuf->base[sVar1 - 1] = (uint8_t)(sVar7 - sVar1);
              iVar3 = buffer_encrypt_record(sendbuf,rec_start,(tls->traffic_protection).enc.aead);
              return iVar3;
            }
          }
        }
      }
    }
  }
  return iVar3;
}

Assistant:

static int send_finished(ptls_t *tls, ptls_buffer_t *sendbuf)
{
    int ret;

    buffer_encrypt(sendbuf, tls->traffic_protection.enc.aead, {
        buffer_push_handshake(sendbuf, tls->key_schedule, PTLS_HANDSHAKE_TYPE_FINISHED, {
            if ((ret = ptls_buffer_reserve(sendbuf, tls->key_schedule->algo->digest_size)) != 0)
                goto Exit;
            if ((ret = calc_verify_data(sendbuf->base + sendbuf->off, tls->key_schedule, tls->traffic_protection.enc.secret)) != 0)
                goto Exit;
            sendbuf->off += tls->key_schedule->algo->digest_size;
        });
    });

Exit:
    return ret;
}